

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void google::protobuf::internal::anon_unknown_22::Register(ExtensionInfo *info)

{
  bool bVar1;
  int iVar2;
  unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
  *this;
  LogMessage *pLVar3;
  LogFinisher local_79;
  string local_78;
  LogMessage local_58;
  ExtensionInfo *local_10;
  ExtensionInfo *info_local;
  
  local_10 = info;
  if ((anonymous_namespace)::Register(google::protobuf::internal::ExtensionInfo_const&)::
      local_static_registry == '\0') {
    iVar2 = __cxa_guard_acquire(&(anonymous_namespace)::
                                 Register(google::protobuf::internal::ExtensionInfo_const&)::
                                 local_static_registry);
    if (iVar2 != 0) {
      this = (unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
              *)operator_new(0x38);
      std::
      unordered_set<google::protobuf::internal::ExtensionInfo,_google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,_google::protobuf::internal::(anonymous_namespace)::ExtensionEq,_std::allocator<google::protobuf::internal::ExtensionInfo>_>
      ::unordered_set(this);
      Register::local_static_registry =
           OnShutdownDelete<std::unordered_set<google::protobuf::internal::ExtensionInfo,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>>
                     (this);
      __cxa_guard_release(&(anonymous_namespace)::
                           Register(google::protobuf::internal::ExtensionInfo_const&)::
                           local_static_registry);
    }
  }
  (anonymous_namespace)::global_registry = Register::local_static_registry;
  bVar1 = InsertIfNotPresent<std::unordered_set<google::protobuf::internal::ExtensionInfo,google::protobuf::internal::(anonymous_namespace)::ExtensionHasher,google::protobuf::internal::(anonymous_namespace)::ExtensionEq,std::allocator<google::protobuf::internal::ExtensionInfo>>>
                    (Register::local_static_registry,local_10);
  if (!bVar1) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/extension_set.cc"
               ,0x75);
    pLVar3 = LogMessage::operator<<(&local_58,"Multiple extension registrations for type \"");
    (*local_10->message->_vptr_MessageLite[2])(&local_78);
    pLVar3 = LogMessage::operator<<(pLVar3,&local_78);
    pLVar3 = LogMessage::operator<<(pLVar3,"\", field number ");
    pLVar3 = LogMessage::operator<<(pLVar3,local_10->number);
    pLVar3 = LogMessage::operator<<(pLVar3,".");
    LogFinisher::operator=(&local_79,pLVar3);
    std::__cxx11::string::~string((string *)&local_78);
    LogMessage::~LogMessage(&local_58);
  }
  return;
}

Assistant:

void Register(const ExtensionInfo& info) {
  static auto local_static_registry = OnShutdownDelete(new ExtensionRegistry);
  global_registry = local_static_registry;
  if (!InsertIfNotPresent(local_static_registry, info)) {
    GOOGLE_LOG(FATAL) << "Multiple extension registrations for type \""
               << info.message->GetTypeName() << "\", field number "
               << info.number << ".";
  }
}